

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Algorithm_Base.cpp
# Opt level: O2

void __thiscall OSTEI_VRR_Algorithm_Base::Create(OSTEI_VRR_Algorithm_Base *this,QAM *q)

{
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  local_70;
  undefined1 local_40 [48];
  
  QAM::QAM((QAM *)local_40,q);
  GenerateQuartetTargets((QuartetSet *)&local_70,(QAM *)local_40);
  Create(this,(QuartetSet *)&local_70);
  std::
  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
  ::~_Rb_tree(&local_70);
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  return;
}

Assistant:

void OSTEI_VRR_Algorithm_Base::Create(QAM q)
{
    Create(GenerateQuartetTargets(q));
}